

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  bool bVar1;
  element_type *peVar2;
  vec3 *u;
  double time;
  double local_b0;
  double local_a8;
  double local_a0;
  ray local_98;
  vec3 local_60;
  undefined1 local_48 [8];
  vec3 scatter_direction;
  ray *scattered_local;
  color *attenuation_local;
  hit_record *rec_local;
  ray *r_in_local;
  lambertian *this_local;
  
  u = &rec->normal;
  scatter_direction.e[2] = (double)scattered;
  random_unit_vector();
  operator+((vec3 *)local_48,u,&local_60);
  bVar1 = vec3::near_zero((vec3 *)local_48);
  if (bVar1) {
    local_48 = (undefined1  [8])(rec->normal).e[0];
    scatter_direction.e[0] = (rec->normal).e[1];
    scatter_direction.e[1] = (rec->normal).e[2];
  }
  ray::time(r_in,(time_t *)u);
  ray::ray(&local_98,&rec->p,(vec3 *)local_48,time);
  memcpy((void *)scatter_direction.e[2],&local_98,0x38);
  peVar2 = std::__shared_ptr_access<texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->tex);
  (*peVar2->_vptr_texture[2])(rec->u,rec->v,&local_b0,peVar2,rec);
  attenuation->e[0] = local_b0;
  attenuation->e[1] = local_a8;
  attenuation->e[2] = local_a0;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        auto scatter_direction = rec.normal + random_unit_vector();

        // Catch degenerate scatter direction
        if (scatter_direction.near_zero())
            scatter_direction = rec.normal;

        scattered = ray(rec.p, scatter_direction, r_in.time());
        attenuation = tex->value(rec.u, rec.v, rec.p);
        return true;
    }